

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O1

Vector * Mul_QV(QMatrix *Q,Vector *V)

{
  Boolean BVar1;
  double Dim;
  size_t *psVar2;
  ElType **ppEVar3;
  ElType **ppEVar4;
  Real *pRVar5;
  Real *pRVar6;
  double dVar7;
  double dVar8;
  bool bVar9;
  LASErrIdType LVar10;
  Vector *V_00;
  char *pcVar11;
  size_t sVar12;
  size_t sVar13;
  char *pcVar14;
  char *pcVar15;
  ElType *pEVar16;
  Real *pRVar17;
  double dVar18;
  size_t sVar19;
  size_t sVar20;
  ulong uVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  Real RVar31;
  double dVar32;
  
  Q_Lock(Q);
  V_Lock(V);
  LVar10 = LASResult();
  if (LVar10 != LASOK) {
    V_00 = (Vector *)0x0;
    goto LAB_0010c144;
  }
  Dim = (double)V->Dim;
  if ((double)Q->Dim != Dim) {
    pcVar11 = Q_GetName(Q);
    pcVar14 = V_GetName(V);
    V_00 = (Vector *)0x0;
    LASError(LASDimErr,"Mul_QV",pcVar11,pcVar14,(char *)0x0);
    goto LAB_0010c144;
  }
  V_00 = (Vector *)malloc(0x30);
  pcVar11 = Q_GetName(Q);
  sVar12 = strlen(pcVar11);
  pcVar11 = V_GetName(V);
  sVar13 = strlen(pcVar11);
  pcVar11 = (char *)malloc(sVar12 + sVar13 + 10);
  pcVar14 = Q_GetName(Q);
  pcVar15 = V_GetName(V);
  if ((V_00 == (Vector *)0x0) || (pcVar11 == (char *)0x0)) {
    LASError(LASMemAllocErr,"Mul_QV",pcVar14,pcVar15,(char *)0x0);
    if (V_00 != (Vector *)0x0) {
      free(V_00);
    }
  }
  else {
    sprintf(pcVar11,"(%s) * (%s)",pcVar14,pcVar15);
    V_Constr(V_00,pcVar11,(size_t)Dim,Tempor,True);
    Q_SortEl(Q);
    Q_AllocInvDiagEl(Q);
    LVar10 = LASResult();
    if ((LVar10 == LASOK) && (Q->ElSorted != (Boolean *)0x0)) {
      psVar2 = Q->Len;
      ppEVar3 = Q->El;
      ppEVar4 = Q->DiagEl;
      pRVar5 = V->Cmp;
      pRVar6 = V_00->Cmp;
      if ((Q->Symmetry != False) || (Q->ElOrder == Clmws)) {
        V_SetAllCmp(V_00,0.0);
      }
      dVar28 = V->Multipl;
      dVar22 = Q->MultiplD * dVar28;
      dVar23 = Q->MultiplU * dVar28;
      dVar28 = dVar28 * Q->MultiplL;
      dVar24 = ABS(dVar22);
      dVar25 = ABS(dVar22 + -1.0);
      if (((dVar24 < 2.2250738585072014e-307) ||
          (2.220446049250313e-15 <= ABS(dVar23 / dVar22 + -1.0))) ||
         (2.220446049250313e-15 <= ABS(dVar28 / dVar22 + -1.0))) {
        bVar9 = true;
      }
      else {
        bVar9 = false;
      }
      dVar26 = ABS(dVar23);
      dVar27 = ABS(dVar28);
      dVar32 = ABS(dVar23 + -1.0);
      dVar29 = ABS(dVar28 + -1.0);
      BVar1 = Q->Symmetry;
      if (BVar1 != False) {
        if (bVar9) {
          if (Dim != 0.0) {
            dVar18 = 4.94065645841247e-324;
            do {
              sVar19 = psVar2[(long)dVar18];
              if (((2.2250738585072014e-307 <= dVar26) && (Q->ElOrder == Rowws)) ||
                 ((dVar30 = 0.0, 2.2250738585072014e-307 <= dVar27 && (Q->ElOrder == Clmws)))) {
                if (sVar19 == 0) {
                  dVar30 = 0.0;
                }
                else {
                  pRVar17 = &ppEVar3[(long)dVar18]->Val;
                  dVar30 = 0.0;
                  sVar20 = sVar19;
                  do {
                    if ((double)((ElType *)(pRVar17 + -1))->Pos != dVar18) {
                      dVar30 = dVar30 + *pRVar17 * pRVar5[((ElType *)(pRVar17 + -1))->Pos];
                    }
                    pRVar17 = pRVar17 + 2;
                    sVar20 = sVar20 - 1;
                  } while (sVar20 != 0);
                }
                if (2.220446049250313e-15 <= dVar32 && 2.2250738585072014e-307 <= dVar26) {
                  dVar30 = dVar30 * dVar23;
                }
                if (2.220446049250313e-15 <= dVar29 && 2.2250738585072014e-307 <= dVar27) {
                  dVar30 = dVar30 * dVar28;
                }
              }
              if (2.2250738585072014e-307 <= dVar24) {
                dVar30 = dVar30 + (double)(~-(ulong)(dVar25 < 2.220446049250313e-15) &
                                           (ulong)(dVar22 * ppEVar4[(long)dVar18]->Val) |
                                          (ulong)ppEVar4[(long)dVar18]->Val &
                                          -(ulong)(dVar25 < 2.220446049250313e-15)) *
                                  pRVar5[(long)dVar18];
              }
              pRVar6[(long)dVar18] = dVar30 + pRVar6[(long)dVar18];
              if (((2.2250738585072014e-307 <= dVar26) && (Q->ElOrder == Clmws)) ||
                 ((2.2250738585072014e-307 <= dVar27 && (Q->ElOrder == Rowws)))) {
                dVar30 = pRVar5[(long)dVar18];
                if (2.220446049250313e-15 <= dVar32 && 2.2250738585072014e-307 <= dVar26) {
                  dVar30 = dVar30 * dVar23;
                }
                if (2.220446049250313e-15 <= dVar29 && 2.2250738585072014e-307 <= dVar27) {
                  dVar30 = dVar30 * dVar28;
                }
                if (sVar19 != 0) {
                  pRVar17 = &ppEVar3[(long)dVar18]->Val;
                  do {
                    dVar7 = (double)((ElType *)(pRVar17 + -1))->Pos;
                    if (dVar7 != dVar18) {
                      pRVar6[(long)dVar7] = *pRVar17 * dVar30 + pRVar6[(long)dVar7];
                    }
                    pRVar17 = pRVar17 + 2;
                    sVar19 = sVar19 - 1;
                  } while (sVar19 != 0);
                }
              }
              dVar18 = (double)((long)dVar18 + 1);
            } while ((ulong)dVar18 <= (ulong)Dim);
          }
        }
        else if (Dim != 0.0) {
          dVar18 = 4.94065645841247e-324;
          uVar21 = -(ulong)(dVar25 < 2.220446049250313e-15);
          do {
            sVar19 = psVar2[(long)dVar18];
            if (sVar19 == 0) {
              dVar30 = 0.0;
            }
            else {
              dVar7 = pRVar5[(long)dVar18];
              pRVar17 = &ppEVar3[(long)dVar18]->Val;
              dVar30 = 0.0;
              do {
                dVar8 = (double)((ElType *)(pRVar17 + -1))->Pos;
                if (dVar8 != dVar18) {
                  pRVar6[(long)dVar8] =
                       *pRVar17 *
                       (double)(~uVar21 & (ulong)(dVar22 * dVar7) | (ulong)dVar7 & uVar21) +
                       pRVar6[(long)dVar8];
                  dVar30 = dVar30 + *pRVar17 * pRVar5[(long)dVar8];
                }
                pRVar17 = pRVar17 + 2;
                sVar19 = sVar19 - 1;
              } while (sVar19 != 0);
            }
            dVar30 = ppEVar4[(long)dVar18]->Val * pRVar5[(long)dVar18] + dVar30;
            pRVar6[(long)dVar18] =
                 (double)(~uVar21 & (ulong)(dVar22 * dVar30) | (ulong)dVar30 & uVar21) +
                 pRVar6[(long)dVar18];
            dVar18 = (double)((long)dVar18 + 1);
          } while ((ulong)dVar18 <= (ulong)Dim);
        }
        if (BVar1 != False) goto LAB_0010c135;
      }
      if (Q->ElOrder == Rowws) {
        if (bVar9) {
          if (Dim != 0.0) {
            dVar18 = 4.94065645841247e-324;
            do {
              sVar19 = psVar2[(long)dVar18];
              RVar31 = 0.0;
              if (2.2250738585072014e-307 <= dVar27) {
                if (sVar19 != 0) {
                  pEVar16 = ppEVar3[(long)dVar18];
                  sVar20 = sVar19;
                  do {
                    if ((ulong)dVar18 <= pEVar16->Pos) break;
                    RVar31 = RVar31 + pEVar16->Val * pRVar5[pEVar16->Pos];
                    pEVar16 = pEVar16 + 1;
                    sVar20 = sVar20 - 1;
                  } while (sVar20 != 0);
                }
                if (2.220446049250313e-15 <= dVar29) {
                  RVar31 = RVar31 * dVar28;
                }
                RVar31 = RVar31 + 0.0;
              }
              if (2.2250738585072014e-307 <= dVar24) {
                RVar31 = RVar31 + (double)(~-(ulong)(dVar25 < 2.220446049250313e-15) &
                                           (ulong)(dVar22 * ppEVar4[(long)dVar18]->Val) |
                                          (ulong)ppEVar4[(long)dVar18]->Val &
                                          -(ulong)(dVar25 < 2.220446049250313e-15)) *
                                  pRVar5[(long)dVar18];
              }
              if (2.2250738585072014e-307 <= dVar26) {
                if (sVar19 == 0) {
                  dVar30 = 0.0;
                }
                else {
                  pRVar17 = &ppEVar3[(long)dVar18][sVar19 - 1].Val;
                  dVar30 = 0.0;
                  do {
                    if (((ElType *)(pRVar17 + -1))->Pos <= (ulong)dVar18) break;
                    dVar30 = dVar30 + *pRVar17 * pRVar5[((ElType *)(pRVar17 + -1))->Pos];
                    pRVar17 = pRVar17 + -2;
                    sVar19 = sVar19 - 1;
                  } while (sVar19 != 0);
                }
                if (2.220446049250313e-15 <= dVar32) {
                  dVar30 = dVar30 * dVar23;
                }
                RVar31 = RVar31 + dVar30;
              }
              pRVar6[(long)dVar18] = RVar31;
              dVar18 = (double)((long)dVar18 + 1);
            } while ((ulong)dVar18 <= (ulong)Dim);
          }
        }
        else if (Dim != 0.0) {
          dVar28 = 4.94065645841247e-324;
          do {
            sVar19 = psVar2[(long)dVar28];
            if (sVar19 == 0) {
              dVar29 = 0.0;
            }
            else {
              pRVar17 = &ppEVar3[(long)dVar28]->Val;
              dVar29 = 0.0;
              do {
                dVar29 = dVar29 + *pRVar17 * pRVar5[((ElType *)(pRVar17 + -1))->Pos];
                pRVar17 = pRVar17 + 2;
                sVar19 = sVar19 - 1;
              } while (sVar19 != 0);
            }
            pRVar6[(long)dVar28] =
                 (Real)(~-(ulong)(dVar25 < 2.220446049250313e-15) & (ulong)(dVar22 * dVar29) |
                       (ulong)dVar29 & -(ulong)(dVar25 < 2.220446049250313e-15));
            dVar28 = (double)((long)dVar28 + 1);
          } while ((ulong)dVar28 <= (ulong)Dim);
        }
      }
      if ((BVar1 == False) && (Q->ElOrder == Clmws)) {
        if (bVar9) {
          if (Dim != 0.0) {
            dVar28 = 4.94065645841247e-324;
            do {
              sVar19 = psVar2[(long)dVar28];
              dVar29 = pRVar5[(long)dVar28];
              if ((2.2250738585072014e-307 <= dVar26) && (sVar19 != 0)) {
                pEVar16 = ppEVar3[(long)dVar28];
                sVar20 = sVar19;
                do {
                  dVar18 = (double)pEVar16->Pos;
                  if ((ulong)dVar28 <= (ulong)dVar18) break;
                  pRVar6[(long)dVar18] =
                       pEVar16->Val *
                       (double)(~-(ulong)(dVar32 < 2.220446049250313e-15) & (ulong)(dVar23 * dVar29)
                               | -(ulong)(dVar32 < 2.220446049250313e-15) & (ulong)dVar29) +
                       pRVar6[(long)dVar18];
                  pEVar16 = pEVar16 + 1;
                  sVar20 = sVar20 - 1;
                } while (sVar20 != 0);
              }
              if (2.2250738585072014e-307 <= dVar24) {
                pRVar6[(long)dVar28] =
                     (double)(~-(ulong)(dVar25 < 2.220446049250313e-15) &
                              (ulong)(dVar22 * ppEVar4[(long)dVar28]->Val) |
                             (ulong)ppEVar4[(long)dVar28]->Val &
                             -(ulong)(dVar25 < 2.220446049250313e-15)) * dVar29 +
                     pRVar6[(long)dVar28];
              }
              if (sVar19 != 0 && 2.2250738585072014e-307 <= dVar27) {
                pRVar17 = &ppEVar3[(long)dVar28][sVar19 - 1].Val;
                do {
                  dVar18 = (double)((ElType *)(pRVar17 + -1))->Pos;
                  if ((ulong)dVar18 <= (ulong)dVar28) break;
                  pRVar6[(long)dVar18] = *pRVar17 * dVar29 + pRVar6[(long)dVar18];
                  pRVar17 = pRVar17 + -2;
                  sVar19 = sVar19 - 1;
                } while (sVar19 != 0);
              }
              dVar28 = (double)((long)dVar28 + 1);
            } while ((ulong)dVar28 <= (ulong)Dim);
          }
        }
        else if (Dim != 0.0) {
          dVar28 = 4.94065645841247e-324;
          do {
            sVar19 = psVar2[(long)dVar28];
            if (sVar19 != 0) {
              dVar23 = pRVar5[(long)dVar28];
              pRVar17 = &ppEVar3[(long)dVar28]->Val;
              do {
                pRVar6[((ElType *)(pRVar17 + -1))->Pos] =
                     *pRVar17 *
                     (double)(~-(ulong)(dVar25 < 2.220446049250313e-15) & (ulong)(dVar22 * dVar23) |
                             (ulong)dVar23 & -(ulong)(dVar25 < 2.220446049250313e-15)) +
                     pRVar6[((ElType *)(pRVar17 + -1))->Pos];
                pRVar17 = pRVar17 + 2;
                sVar19 = sVar19 - 1;
              } while (sVar19 != 0);
            }
            dVar28 = (double)((long)dVar28 + 1);
          } while ((ulong)dVar28 <= (ulong)Dim);
        }
      }
    }
    else {
      LVar10 = LASResult();
      if ((LVar10 == LASOK) && (*Q->ElSorted == False)) {
        pcVar14 = Q_GetName(Q);
        pcVar15 = V_GetName(V);
        LASError(LASElNotSortedErr,"Mul_QV",pcVar14,pcVar15,(char *)0x0);
      }
    }
  }
LAB_0010c135:
  if (pcVar11 != (char *)0x0) {
    free(pcVar11);
  }
LAB_0010c144:
  Q_Unlock(Q);
  V_Unlock(V);
  return V_00;
}

Assistant:

Vector *Mul_QV(QMatrix *Q, Vector *V)
/* VRes = Q * V */
{
    Vector *VRes;

    char *VResName;
    double MultiplDV, MultiplUV, MultiplLV;
    double Sum, PartSum, Cmp, PartCmp;
    size_t Dim, Row, Clm, RoC, Len, ElCount;
    size_t *QLen;
    Boolean MultiplDVIsZero, MultiplUVIsZero, MultiplLVIsZero;
    Boolean MultiplDVIsOne, MultiplUVIsOne, MultiplLVIsOne;
    Boolean MultiplDULVEquals;
    ElType **QEl, **QDiagEl, *PtrEl;
    Real *VCmp, *VResCmp;

    Q_Lock(Q);
    V_Lock(V);
    
    if (LASResult() == LASOK) {
        if (Q->Dim == V->Dim) {
            Dim = V->Dim;
            VRes = (Vector *)malloc(sizeof(Vector));
            VResName = (char *)malloc((strlen(Q_GetName(Q)) + strlen(V_GetName(V)) + 10)
                           * sizeof(char));
            if (VRes != NULL && VResName != NULL) {
                sprintf(VResName, "(%s) * (%s)", Q_GetName(Q), V_GetName(V));
                V_Constr(VRes, VResName, Dim, Tempor, True);
                
                /* sort of elements and allocation of diagonal elements
                   of the matrix Q */
                Q_SortEl(Q);
                Q_AllocInvDiagEl(Q);

                if (LASResult() == LASOK && Q->ElSorted) {
                    /* assignment of auxiliary lokal variables */
                    QLen = Q->Len;
                    QEl = Q->El;
                    QDiagEl = Q->DiagEl;
                    VCmp = V->Cmp;
                    VResCmp = VRes->Cmp;

                    /* initialisation of the vector VRes */
                    if (Q->Symmetry || Q->ElOrder == Clmws)
                        V_SetAllCmp(VRes, 0.0);

                    /* analysis of multipliers of the lower, diagonal and upper part
                       of the matrix Q and of the vector V */
                    MultiplDV = Q->MultiplD * V->Multipl;
                    MultiplUV = Q->MultiplU * V->Multipl;
                    MultiplLV = Q->MultiplL * V->Multipl;
                    MultiplDVIsZero = IsZero(MultiplDV);
                    MultiplUVIsZero = IsZero(MultiplUV);
                    MultiplLVIsZero = IsZero(MultiplLV);
                    MultiplDVIsOne = IsOne(MultiplDV);
                    MultiplUVIsOne = IsOne(MultiplUV);
                    MultiplLVIsOne = IsOne(MultiplLV);
                    if (!IsZero(MultiplDV) && IsOne(MultiplUV / MultiplDV)
                        && IsOne(MultiplLV / MultiplDV)) {
                        MultiplDULVEquals = True;
                    } else {
                        MultiplDULVEquals = False;
                    }

                    /* multiplication of the lower, diagonal and upper part
                       of the matrix Q by the vector V */
                    if (Q->Symmetry) {
                        if (MultiplDULVEquals) {
                            for (RoC = 1; RoC <= Dim; RoC++) {
                                Len = QLen[RoC];
                                PtrEl = QEl[RoC];
                                   Sum = 0.0;
                                if (!MultiplDVIsOne)
                                    Cmp = MultiplDV * VCmp[RoC];
                                else
                                       Cmp = VCmp[RoC];
                                for (ElCount = Len; ElCount > 0; ElCount--) {
                                    if ((*PtrEl).Pos != RoC) {
                                        VResCmp[(*PtrEl).Pos] += (*PtrEl).Val * Cmp;
                                        Sum += (*PtrEl).Val * VCmp[(*PtrEl).Pos];
                                    }
                                    PtrEl++;
                                }
                                Sum += (*QDiagEl[RoC]).Val * VCmp[RoC];
                                if (MultiplDVIsOne)
                                    VResCmp[RoC] += Sum;
                                else
                                    VResCmp[RoC] += MultiplDV * Sum;
                                  }
                        } else {
                            for (RoC = 1; RoC <= Dim; RoC++) {
                                Len = QLen[RoC];
                                   Sum = 0.0;
                                if ((!MultiplUVIsZero && Q->ElOrder == Rowws)
                                    || (!MultiplLVIsZero && Q->ElOrder == Clmws)) {
                                    PtrEl = QEl[RoC];
                                        for (ElCount = Len; ElCount > 0; ElCount--) {
                                        if ((*PtrEl).Pos != RoC) {
                                            Sum += (*PtrEl).Val * VCmp[(*PtrEl).Pos];
                                        }
                                        PtrEl++;
                                    }
                                    if (!MultiplUVIsZero && !MultiplUVIsOne)
                                           Sum = MultiplUV * Sum;
                                    if (!MultiplLVIsZero && !MultiplLVIsOne)
                                           Sum = MultiplLV * Sum;
                                }
                                if (!MultiplDVIsZero) {
                                    if (MultiplDVIsOne) {
                                        Sum += (*QDiagEl[RoC]).Val * VCmp[RoC];
                                    }
                                    else { // changed
                                        Sum += MultiplDV * (*QDiagEl[RoC]).Val * VCmp[RoC];
                                    }
                                }
                                VResCmp[RoC] += Sum;
                                if ((!MultiplUVIsZero && Q->ElOrder == Clmws)
                                    || (!MultiplLVIsZero && Q->ElOrder == Rowws)) {
                                      Cmp = VCmp[RoC];
                                    if (!MultiplUVIsZero && !MultiplUVIsOne)
                                         Cmp *= MultiplUV;
                                    if (!MultiplLVIsZero && !MultiplLVIsOne)
                                             Cmp *= MultiplLV;
                                    PtrEl = QEl[RoC];
                                        for (ElCount = Len; ElCount > 0; ElCount--) {
                                        if ((*PtrEl).Pos != RoC)
                                             VResCmp[(*PtrEl).Pos] += (*PtrEl).Val * Cmp;
                                        PtrEl++;
                                    }
                                }
                              }
                        }
                    }
                    if (!Q->Symmetry && Q->ElOrder == Rowws) {
                        if (MultiplDULVEquals) {
                            for (Row = 1; Row <= Dim; Row++) {
                                Len = QLen[Row];
                                PtrEl = QEl[Row];
                                    Sum = 0.0;
                                for (ElCount = Len; ElCount > 0; ElCount--) {
                                    Sum += (*PtrEl).Val * VCmp[(*PtrEl).Pos];
                                    PtrEl++;
                                }
                                if (MultiplDVIsOne)
                                    VResCmp[Row] = Sum;
                                else
                                    VResCmp[Row] = MultiplDV * Sum;
                              }
                          } else {
                            for (Row = 1; Row <= Dim; Row++) {
                                Len = QLen[Row];
                                Sum = 0.0;
                                if (!MultiplLVIsZero) {
                                    PtrEl = QEl[Row];
                                        PartSum = 0.0;
                                      for (ElCount = Len; ElCount > 0 && (*PtrEl).Pos < Row;
                                        ElCount--) {
                                        PartSum += (*PtrEl).Val * VCmp[(*PtrEl).Pos];
                                        PtrEl++;
                                    }
                                    if (MultiplLVIsOne)
                                        Sum += PartSum;
                                    else
                                        Sum += MultiplLV * PartSum;
                                }
                                if (!MultiplDVIsZero) {
                                    if (MultiplDVIsOne)
                                        Sum += (*QDiagEl[Row]).Val * VCmp[Row];
                                    else
                                        Sum += MultiplDV * (*QDiagEl[Row]).Val * VCmp[Row];
                                }
                                if (!MultiplUVIsZero) {
                                    PtrEl = QEl[Row] + Len - 1;
                                        PartSum = 0.0;
                                      for (ElCount = Len; ElCount > 0 && (*PtrEl).Pos > Row;
                                        ElCount--) {
                                        PartSum += (*PtrEl).Val * VCmp[(*PtrEl).Pos];
                                        PtrEl--;
                                    }
                                    if (MultiplUVIsOne)
                                        Sum += PartSum;
                                    else
                                        Sum += MultiplUV * PartSum;
                                }
                                VResCmp[Row] = Sum;
                              }
                        }
                    }
                    if (!Q->Symmetry && Q->ElOrder == Clmws) {
                        if (MultiplDULVEquals) {
                             for (Clm = 1; Clm <= Dim; Clm++) {
                                Len = QLen[Clm];
                                PtrEl = QEl[Clm];
                                if (MultiplDVIsOne)
                                       Cmp = VCmp[Clm];
                                else
                                    Cmp = MultiplDV * VCmp[Clm];
                                for (ElCount = Len; ElCount > 0; ElCount--) {
                                    VResCmp[(*PtrEl).Pos] += (*PtrEl).Val * Cmp;
                                    PtrEl++;
                                }
                            }
                          } else {
                            for (Clm = 1; Clm <= Dim; Clm++) {
                                Len = QLen[Clm];
                                Cmp = VCmp[Clm];
                                if (!MultiplUVIsZero) {
                                    PtrEl = QEl[Clm];
                                    if (MultiplUVIsOne)
                                        PartCmp = Cmp;
                                    else
                                        PartCmp = MultiplUV * Cmp;
                                      for (ElCount = Len; ElCount > 0 && (*PtrEl).Pos < Clm;
                                        ElCount--) {
                                         VResCmp[(*PtrEl).Pos] += (*PtrEl).Val * PartCmp;
                                        PtrEl++;
                                    }
                                }
                                if (!MultiplDVIsZero) {
                                    if (MultiplDVIsOne)
                                         VResCmp[Clm] += (*QDiagEl[Clm]).Val * Cmp;
                                    else
                                         VResCmp[Clm] += MultiplDV * (*QDiagEl[Clm]).Val * Cmp;
                                }
                                if (!MultiplLVIsZero) {
                                    PtrEl = QEl[Clm] + Len - 1;
                                    if (MultiplLVIsOne)
                                        PartCmp = Cmp;
                                    else
                                        PartCmp = MultiplLV * Cmp;
                                      for (ElCount = Len; ElCount > 0 && (*PtrEl).Pos > Clm;
                                        ElCount--) {
                                         VResCmp[(*PtrEl).Pos] += (*PtrEl).Val * Cmp;
                                        PtrEl--;
                                    }
                                }
                              }
                        }
                    }
                } else {
                    if (LASResult() == LASOK && !(*Q->ElSorted))
                        LASError(LASElNotSortedErr, "Mul_QV", Q_GetName(Q), V_GetName(V), NULL);
                }
            } else {
                LASError(LASMemAllocErr, "Mul_QV", Q_GetName(Q), V_GetName(V), NULL);
                if (VRes != NULL)
                    free(VRes);
            }
            
            if (VResName != NULL)
                free(VResName);
        } else {
            LASError(LASDimErr, "Mul_QV", Q_GetName(Q), V_GetName(V), NULL);
            VRes = NULL;
        }
    } else {
        VRes = NULL;
    }

    Q_Unlock(Q);
    V_Unlock(V);

    return(VRes);
}